

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O2

vector<Section_*,_std::allocator<Section_*>_> *
get_sections_by_input_blob
          (vector<Section_*,_std::allocator<Section_*>_> *__return_storage_ptr__,
          deque<Section_*,_std::allocator<Section_*>_> *dnet,string *blob)

{
  _Elt_pointer ppSVar1;
  pointer pbVar2;
  __type _Var3;
  _Elt_pointer ppSVar4;
  pointer pbVar5;
  Section *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  _Map_pointer local_70;
  _Elt_pointer local_68;
  Section *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppSVar4 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_68 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_70 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppSVar1 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppSVar4 != ppSVar1) {
    local_58 = *ppSVar4;
    pbVar2 = (local_58->input_blobs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (local_58->input_blobs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
      _Var3 = std::operator==(&local_50,blob);
      if (_Var3) {
        std::vector<Section_*,_std::allocator<Section_*>_>::push_back
                  (__return_storage_ptr__,&local_58);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    ppSVar4 = ppSVar4 + 1;
    if (ppSVar4 == local_68) {
      ppSVar4 = local_70[1];
      local_70 = local_70 + 1;
      local_68 = ppSVar4 + 0x40;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Section*> get_sections_by_input_blob(std::deque<Section*>& dnet, std::string blob)
{
    std::vector<Section*> ret;
    for (auto s : dnet)
        for (auto b : s->input_blobs)
            if (b == blob)
                ret.push_back(s);
    return ret;
}